

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

atom * orientedAtoms(xformDatabase *xdb)

{
  uint uVar1;
  int iVar2;
  atom *paVar3;
  long lVar4;
  double dVar5;
  atom *paVar6;
  long lVar7;
  xformAtomRecords **ppxVar8;
  xformAtomRecords *pxVar9;
  matrix4 *pmVar10;
  matrix4 *pmVar11;
  transformData *ptVar12;
  byte bVar13;
  matrix4 rsltMat;
  matrix4 ctm;
  
  bVar13 = 0;
  if (xdb == (xformDatabase *)0x0) {
    return (atom *)0x0;
  }
  initializeXFStack(xdb);
  v3identityMat(&ctm);
  lVar4 = 0x10;
  ptVar12 = (transformData *)xdb;
  do {
    ptVar12 = ptVar12->next;
    if (ptVar12 == (transformData *)0x0) {
      ppxVar8 = xdb->sortedByRes;
      paVar6 = (atom *)0x0;
      if (ppxVar8 != (xformAtomRecords **)0x0) {
        for (; *ppxVar8 != (xformAtomRecords *)0x0; ppxVar8 = ppxVar8 + 1) {
          paVar3 = (*ppxVar8)->a;
          paVar3->next = paVar6;
          paVar6 = paVar3;
        }
      }
      return paVar6;
    }
    lVar7 = lVar4;
    pmVar10 = &ctm;
    if (ptVar12->type == 4) {
      iVar2 = xdb->nstack;
      if (iVar2 < 1) {
        pmVar11 = (matrix4 *)0x0;
        goto LAB_00121328;
      }
      pmVar10 = xdb->ctmstack[iVar2 - 1U];
      pmVar11 = &ctm;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        pmVar11->element[0][0] = pmVar10->element[0][0];
        pmVar10 = (matrix4 *)((long)pmVar10 + ((ulong)bVar13 * -2 + 1) * 8);
        pmVar11 = (matrix4 *)((long)pmVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      if (iVar2 != 1) {
        xdb->nstack = iVar2 - 1U;
      }
    }
    else {
      if (ptVar12->type == 3) {
        uVar1 = xdb->nstack;
        if (6 < uVar1 - 1) goto LAB_0012132b;
        xdb->nstack = uVar1 + 1;
        pmVar11 = &ctm;
        pmVar10 = xdb->ctmstack[uVar1];
      }
      else {
        v3matMul(&ptVar12->tmat,&ctm,&rsltMat);
        pmVar11 = &rsltMat;
      }
LAB_00121328:
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        pmVar10->element[0][0] = pmVar11->element[0][0];
        pmVar11 = (matrix4 *)((long)pmVar11 + ((ulong)bVar13 * -2 + 1) * 8);
        pmVar10 = (matrix4 *)((long)pmVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      }
    }
LAB_0012132b:
    pxVar9 = (xformAtomRecords *)&ptVar12->recs;
    while (pxVar9 = pxVar9->next, pxVar9 != (xformAtomRecords *)0x0) {
      paVar6 = pxVar9->a;
      (paVar6->loc).z = (pxVar9->loc).z;
      dVar5 = (pxVar9->loc).y;
      (paVar6->loc).x = (pxVar9->loc).x;
      (paVar6->loc).y = dVar5;
      v3mulPointMat(&paVar6->loc,&ctm);
    }
  } while( true );
}

Assistant:

atom* orientedAtoms(xformDatabase* xdb) {
   transformData* xform = NULL;
   xformAtomRecords* xa = NULL;
   matrix4 ctm, rsltMat;
   atom* alst = NULL, *a = NULL;

   if (xdb) {
      initializeXFStack(xdb);

      v3identityMat(&ctm);

      for (xform = xdb->xforms; xform; xform = xform->next) {
	 if (xform->type == SAVExform) {
	       pushXFStack(xdb, &ctm);
	 }
	 else if (xform->type == RESTORExform) {
	    ctm = * topXFStack(xdb);
	    popXFStack(xdb);
	 }
	 else if (xform != NULLxform) {
	    v3matMul(&(xform->tmat), &ctm, &rsltMat);
	    ctm = rsltMat;
	 }

	 for(xa = xform->recs; xa; xa = xa->next) {
	    a = xa->a;

	    a->loc = xa->loc;                /* apply ctm to the original loc of each atom  */
	    v3mulPointMat(&(a->loc), &ctm); /* and use to set the new position of the atom */
	 }
      }

      alst = NULL;
      if (xdb->sortedByRes) { /* (re-)compose the atom list from the sort index */
	 int i = 0;
	 for(i=0; xdb->sortedByRes[i]; i++) {
	    a = xdb->sortedByRes[i]->a;
	    a->next = alst;
	    alst = a;
	 }
      }
   }

   return alst; /* returns the list of (pre-)sorted atoms */
}